

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  reference ppcVar3;
  char *pcVar4;
  pointer pvVar5;
  ostream *poVar6;
  string local_2d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
  local_2b0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
  local_2a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_true>
  local_2a0;
  const_iterator ti;
  cmGeneratedFileStream fout;
  allocator local_39;
  string local_38 [8];
  string fname;
  cmMakefile *mf;
  cmGlobalGenerator *this_local;
  
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (&this->LocalGenerators,0);
  fname.field_2._8_8_ = cmLocalGenerator::GetMakefile(*ppcVar3);
  pcVar4 = cmMakefile::GetHomeOutputDirectory((cmMakefile *)fname.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar4,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar4 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=(local_38,pcVar4);
  std::__cxx11::string::operator+=(local_38,"/TargetDirectories.txt");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&ti,pcVar4,false);
  local_2a8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
       ::begin(&this->TotalTargets);
  std::__detail::
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
              *)&local_2a0,
             (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
              *)&local_2a8);
  while( true ) {
    local_2b0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
         ::end(&this->TotalTargets);
    bVar1 = std::__detail::operator!=(&local_2a0,&local_2b0);
    if (!bVar1) break;
    pvVar5 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
                           *)&local_2a0);
    TVar2 = cmTarget::GetType(pvVar5->second);
    if (TVar2 != INTERFACE_LIBRARY) {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
                             *)&local_2a0);
      WriteSummary(this,pvVar5->second);
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
                             *)&local_2a0);
      cmTarget::GetSupportDirectory_abi_cxx11_(&local_2d0,pvVar5->second);
      poVar6 = std::operator<<((ostream *)&ti,(string *)&local_2d0);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_false,_true>
                  *)&local_2a0);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&ti);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary()
{
  cmMakefile* mf = this->LocalGenerators[0]->GetMakefile();

  // Record all target directories in a central location.
  std::string fname = mf->GetHomeOutputDirectory();
  fname += cmake::GetCMakeFilesDirectory();
  fname += "/TargetDirectories.txt";
  cmGeneratedFileStream fout(fname.c_str());

  // Generate summary information files for each target.
  for(TargetMap::const_iterator ti =
        this->TotalTargets.begin(); ti != this->TotalTargets.end(); ++ti)
    {
    if ((ti->second)->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    this->WriteSummary(ti->second);
    fout << ti->second->GetSupportDirectory() << "\n";
    }
}